

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O1

bool InquisitorCheckDistance(AActor *self)

{
  bool bVar1;
  bool bVar2;
  AActor *pAVar3;
  double dVar4;
  
  if (self->reactiontime == 0) {
    pAVar3 = (self->target).field_0.p;
    if ((pAVar3 != (AActor *)0x0) &&
       (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (self->target).field_0.p = (AActor *)0x0;
      pAVar3 = (AActor *)0x0;
    }
    bVar2 = false;
    bVar1 = P_CheckSight(self,pAVar3,0);
    if (bVar1) {
      pAVar3 = (self->target).field_0.p;
      if ((pAVar3 != (AActor *)0x0) &&
         (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (self->target).field_0.p = (AActor *)0x0;
        pAVar3 = (AActor *)0x0;
      }
      dVar4 = AActor::Distance2D(self,pAVar3,false);
      bVar2 = dVar4 < 264.0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool InquisitorCheckDistance (AActor *self)
{
	if (self->reactiontime == 0 && P_CheckSight (self, self->target))
	{
		return self->Distance2D (self->target) < 264.;
	}
	return false;
}